

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::doHidePopup(QComboBoxPrivate *this)

{
  Data *pDVar1;
  QWidget *this_00;
  
  pDVar1 = (this->container).wp.d;
  if (((pDVar1 != (Data *)0x0) &&
      (this_00 = (QWidget *)(this->container).wp.value,
      this_00 != (QWidget *)0x0 && *(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->data->widget_attributes & 0x8000) != 0)) {
    QWidget::hide(this_00);
  }
  updateArrow(this,State_None);
  return;
}

Assistant:

void QComboBoxPrivate::doHidePopup()
{
    if (container && container->isVisible())
        container->hide();

    resetButton();
}